

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O3

cmValue __thiscall
cmStandardLevelResolver::CompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *lang,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  cmGlobalGenerator *this_00;
  long *plVar4;
  cmValue cVar5;
  ostream *poVar6;
  string *psVar7;
  _func_int **pp_Var8;
  size_type *psVar9;
  char *pcVar10;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  bVar3 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
  if (bVar3) {
    pcVar2 = this->Makefile;
    std::operator+(&local_228,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
    pp_Var8 = (_func_int **)(plVar4 + 2);
    if ((_func_int **)*plVar4 == pp_Var8) {
      local_198[0]._0_8_ = *pp_Var8;
      local_198[0]._8_8_ = plVar4[3];
      local_1a8._0_8_ = local_1a8 + 0x10;
    }
    else {
      local_198[0]._0_8_ = *pp_Var8;
      local_1a8._0_8_ = (_func_int **)*plVar4;
    }
    local_1a8._8_8_ = plVar4[1];
    *plVar4 = (long)pp_Var8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cVar5 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    paVar1 = &local_228.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((cVar5.Value != (string *)0x0) && ((cVar5.Value)->_M_string_length != 0)) {
      return (cmValue)cVar5.Value;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar10 = "no";
    if (error == (string *)0x0) {
      pcVar10 = "No";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," known features for ",0x14);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," compiler\n\"",0xb);
    pcVar2 = this->Makefile;
    std::operator+(&local_1c8,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    psVar9 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_228.field_2._M_allocated_capacity = *psVar9;
      local_228.field_2._8_8_ = plVar4[3];
      local_228._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar9;
      local_228._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_228._M_string_length = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_228);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\nversion ",10);
    pcVar2 = this->Makefile;
    std::operator+(&local_1e8,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar9 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_208.field_2._M_allocated_capacity = *psVar9;
      local_208.field_2._8_8_ = plVar4[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar9;
      local_208._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_208._M_string_length = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_208);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (error == (string *)0x0) {
      pcVar2 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_228);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_228);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == paVar1) goto LAB_001dce32;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar10 = "cannot";
    if (error == (string *)0x0) {
      pcVar10 = "Cannot";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," use features from non-enabled language ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    if (error == (string *)0x0) {
      pcVar2 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_228);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_228);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_001dce32;
  }
  operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
LAB_001dce32:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmStandardLevelResolver::CompileFeaturesAvailable(
  const std::string& lang, std::string* error) const
{
  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }

  cmValue featuresKnown =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!cmNonempty(featuresKnown)) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang +
                                           "_COMPILER_VERSION")
      << ".";
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }
  return featuresKnown;
}